

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyForce::ComputeQ(ChLoadBodyForce *this,ChState *state_x,ChStateDelta *state_w)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  Scalar *pSVar6;
  ChVectorDynamic<> mF;
  double local_88;
  double *local_78;
  double dStack_70;
  shared_ptr<chrono::ChBody> mbody;
  double detJ;
  double *local_38;
  double dStack_30;
  
  std::dynamic_pointer_cast<chrono::ChBody,chrono::ChLoadable>
            ((shared_ptr<chrono::ChLoadable> *)&mbody);
  iVar5 = (*((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3c])();
  if (*(char *)(CONCAT44(extraout_var,iVar5) + 0x2c) == '\0') {
    if (this->m_local_force == true) {
      ChMatrix33<double>::operator*
                (&((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix,
                 &this->m_force);
      local_78 = mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dStack_70 = (double)mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
      dVar1 = local_88;
    }
    else {
      local_78 = (double *)(this->m_force).m_data[0];
      dStack_70 = (this->m_force).m_data[1];
      dVar1 = (this->m_force).m_data[2];
    }
    dVar2 = this->m_scale;
    if (this->m_local_point == true) {
      ChFrame<double>::TransformPointLocalToParent
                ((ChVector<double> *)&mF,
                 (ChFrame<double> *)
                 &(mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChBodyFrame,&this->m_point);
      local_38 = mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dStack_30 = (double)mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
    }
    else {
      local_38 = (double *)(this->m_point).m_data[0];
      dStack_30 = (this->m_point).m_data[1];
      local_88 = (this->m_point).m_data[2];
    }
    detJ._0_4_ = (*((this->super_ChLoadCustom).loadable.
                    super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ChLoadable[7])();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&mF,(int *)&detJ);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,0);
    *pSVar6 = dVar2 * (double)local_78;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,1);
    auVar3._8_8_ = dStack_70;
    auVar3._0_8_ = local_78;
    auVar3 = vshufpd_avx(auVar3,auVar3,1);
    *pSVar6 = dVar2 * auVar3._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,2);
    *pSVar6 = dVar2 * dVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,3);
    *pSVar6 = 0.0;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,4);
    *pSVar6 = 0.0;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&mF,5);
    *pSVar6 = 0.0;
    auVar4._8_8_ = dStack_30;
    auVar4._0_8_ = local_38;
    auVar3 = vshufpd_avx(auVar4,auVar4,1);
    (*((mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x44])
              (local_38,auVar3._0_8_,local_88,
               mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(this->super_ChLoadCustom).load_Q,&detJ,&mF,state_x,state_w);
    Eigen::internal::handmade_aligned_free
              (mF.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mbody.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ChLoadBodyForce::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbody = std::dynamic_pointer_cast<ChBody>(this->loadable);
    if (!mbody->Variables().IsActive())
        return;

    ChVector<> abs_force;
    if (m_local_force)
        abs_force = mbody->TransformDirectionLocalToParent(m_force);
    else
        abs_force = m_force;

    abs_force *= m_scale;

    ChVector<> abs_point;
    if (m_local_point)
        abs_point = mbody->TransformPointLocalToParent(m_point);
    else
        abs_point = m_point;

    // ChBody assumes F={force_abs, torque_abs}
    ChVectorDynamic<> mF(loadable->Get_field_ncoords());
    mF(0) = abs_force.x();
    mF(1) = abs_force.y();
    mF(2) = abs_force.z();
    mF(3) = 0;
    mF(4) = 0;
    mF(5) = 0;

    // Compute Q = N(u,v,w)'*F
    double detJ;  // not used
    mbody->ComputeNF(abs_point.x(), abs_point.y(), abs_point.z(), load_Q, detJ, mF, state_x, state_w);
}